

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void assert_solvers_return_equal_cost<int>
               (matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                *cost_matrix)

{
  long *plVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  int total_cost;
  int total_cost_brute_force;
  string local_128;
  string local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment_brute_force;
  string local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  int *local_88;
  int *local_80;
  undefined1 local_78;
  undefined8 local_70;
  long *plStack_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffff00000000;
  total_cost = hungarian_algorithm::
               solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<int>>
                         (cost_matrix,cost_matrix->size1_,cost_matrix->size2_,&assignment,
                          (less<int> *)&local_108,(int *)&local_128);
  local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffff00000000;
  total_cost_brute_force =
       hungarian_algorithm::
       solveBruteForce<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<int>>
                 (cost_matrix,cost_matrix->size1_,cost_matrix->size2_,&assignment_brute_force,
                  (less<int> *)&local_108,(int *)&local_128);
  if (total_cost != total_cost_brute_force) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"total_cost != total_cost_brute_force:",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  total_cost: ",0xe);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,total_cost);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  total_cost_brute_force: ",0x1a);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,total_cost_brute_force);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  cost_matrix: [",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    plVar4 = (long *)std::ostream::flush();
    *(undefined8 *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x10) = 3;
    paVar3 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"    ","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,", ","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,";\n","");
    print_matrix<int>((ostream *)&std::cerr,cost_matrix,&local_128,&local_108,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ]",3);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  Hungarian assignment:",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    local_128._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"    ","");
    print_assignment<int>((ostream *)&std::cerr,&assignment,cost_matrix,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  brute force assignment:",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    local_128._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"    ","");
    print_assignment<int>((ostream *)&std::cerr,&assignment_brute_force,cost_matrix,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0xcd);
  local_c8._M_string_length._0_1_ = 0;
  local_c8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00126b48;
  local_c8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_80 = &total_cost;
  local_88 = &total_cost_brute_force;
  local_78 = total_cost == total_cost_brute_force;
  local_c8.field_2._8_8_ = (long)"\x03" + 1;
  local_70 = 0;
  plStack_68 = (long *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_38 = "";
  local_128.field_2._8_8_ = &local_80;
  local_128._M_string_length._0_1_ = 0;
  local_128._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00126a90;
  local_128.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_108.field_2._8_8_ = &local_88;
  local_108._M_string_length._0_1_ = 0;
  local_108._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00126a90;
  local_108.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  plVar4 = plStack_68;
  if (plStack_68 != (long *)0x0) {
    LOCK();
    plVar1 = plStack_68 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plStack_68 + 0x10))(plStack_68);
      LOCK();
      piVar2 = (int *)((long)plVar4 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        (**(code **)(*plVar4 + 0x18))(plVar4);
      }
    }
  }
  if (assignment_brute_force.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(assignment_brute_force.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(assignment.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assert_solvers_return_equal_cost(const ublas::matrix<Cost>& cost_matrix)
{
  std::vector<std::size_t> assignment, assignment_brute_force;
  const Cost total_cost = hungarian_algorithm::solve<Cost>(
    cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment);
  const Cost total_cost_brute_force = hungarian_algorithm::solveBruteForce<Cost>(
    cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment_brute_force);
  if (total_cost != total_cost_brute_force)
  {
    std::cerr << "total_cost != total_cost_brute_force:" << std::endl;
    std::cerr << "  total_cost: " << total_cost << std::endl;
    std::cerr << "  total_cost_brute_force: " << total_cost_brute_force << std::endl;
    std::cerr << "  cost_matrix: [" << std::endl << std::setw(3);
    print_matrix(std::cerr, cost_matrix, "    ");
    std::cerr << "  ]" << std::endl;
    std::cerr << "  Hungarian assignment:" << std::endl;
    print_assignment(std::cerr, assignment, cost_matrix, "    ");
    std::cerr << "  brute force assignment:" << std::endl;
    print_assignment(std::cerr, assignment_brute_force, cost_matrix, "    ");
  }
  BOOST_CHECK_EQUAL(total_cost, total_cost_brute_force);
}